

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# internal_timer.hxx
# Opt level: O0

bool __thiscall nuraft::timer_helper::timeout(timer_helper *this)

{
  type __d;
  duration<double,_std::ratio<1L,_1L>_> *in_RDI;
  double dVar1;
  rep_conflict rVar2;
  undefined1 auVar3 [16];
  duration<double,_std::ratio<1L,_1L>_> elapsed;
  lock_guard<std::mutex> l;
  time_point cur;
  mutex_type *in_stack_ffffffffffffff98;
  lock_guard<std::mutex> *in_stack_ffffffffffffffa0;
  time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  *in_stack_ffffffffffffffa8;
  duration<double,_std::ratio<1L,_1L>_> local_30;
  undefined4 local_24;
  undefined8 local_18;
  bool local_1;
  
  local_18 = std::chrono::_V2::system_clock::now();
  std::lock_guard<std::mutex>::lock_guard(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
  if (((ulong)in_RDI[2].__r & 1) == 0) {
    *(undefined1 *)&in_RDI[2].__r = 1;
    local_1 = true;
  }
  else {
    __d = std::chrono::operator-
                    (in_stack_ffffffffffffffa8,
                     (time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                      *)in_stack_ffffffffffffffa0);
    std::chrono::duration<double,std::ratio<1l,1l>>::duration<long,std::ratio<1l,1000000000l>,void>
              (in_RDI,(duration<long,_std::ratio<1L,_1000000000L>_> *)__d.__r);
    rVar2 = in_RDI[1].__r;
    auVar3._8_4_ = (int)((ulong)rVar2 >> 0x20);
    auVar3._0_8_ = rVar2;
    auVar3._12_4_ = 0x45300000;
    dVar1 = (auVar3._8_8_ - 1.9342813113834067e+25) +
            ((double)CONCAT44(0x43300000,SUB84(rVar2,0)) - 4503599627370496.0);
    rVar2 = std::chrono::duration<double,_std::ratio<1L,_1L>_>::count(&local_30);
    local_1 = dVar1 < rVar2 * 1000000.0;
  }
  local_24 = 1;
  std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)0x2cc780);
  return (bool)(local_1 & 1);
}

Assistant:

bool timeout() {
        auto cur = std::chrono::system_clock::now();

        std::lock_guard<std::mutex> l(lock_);
        if (!first_event_fired_) {
            // First event, return `true` immediately.
            first_event_fired_ = true;
            return true;
        }

        std::chrono::duration<double> elapsed = cur - t_created_;
        return (duration_us_ < elapsed.count() * 1000000);
    }